

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O3

vector<folding_set,_std::allocator<folding_set>_> *
folding_sets_from_folding_info
          (vector<folding_set,_std::allocator<folding_set>_> *__return_storage_ptr__,
          vector<folding_info,_std::allocator<folding_info>_> *in_info)

{
  pointer *ppfVar1;
  uint uVar2;
  pointer pfVar3;
  iterator iVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  pointer pfVar12;
  folding_set local_48;
  
  (__return_storage_ptr__->super__Vector_base<folding_set,_std::allocator<folding_set>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<folding_set,_std::allocator<folding_set>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<folding_set,_std::allocator<folding_set>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.diff = 0;
  local_48.mode = single;
  local_48.range_start = 0;
  pfVar12 = (in_info->super__Vector_base<folding_info,_std::allocator<folding_info>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pfVar3 = (in_info->super__Vector_base<folding_info,_std::allocator<folding_info>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pfVar12 != pfVar3) {
    iVar8 = 2;
    lVar7 = 0;
    local_48._8_8_ = 0;
    lVar10 = 0;
    do {
      uVar2 = pfVar12->in_codepoint;
      uVar6 = (ulong)uVar2;
      lVar11 = pfVar12->out_codepoint - uVar6;
      if (lVar10 == 0) {
        local_48.range_start = uVar2;
        lVar7 = lVar11;
        local_48.diff = lVar11;
      }
      else {
        iVar5 = (int)local_48._8_8_;
        if (iVar8 == 2) {
          if (uVar2 == iVar5 + 1U && lVar11 == lVar10) {
            local_48._0_8_ = (ulong)local_48.range_start << 0x20;
            iVar8 = 0;
          }
          else {
            if (uVar2 != iVar5 + 2U || lVar11 != lVar10) goto LAB_00200d30;
            local_48.mode = 1;
            iVar8 = 1;
          }
        }
        else {
          if ((iVar8 == 0) && (lVar10 == lVar11)) {
            uVar9 = iVar5 + 1;
            iVar8 = 0;
          }
          else {
            if ((iVar8 != 1) || (lVar10 != lVar11)) goto LAB_00200d30;
            uVar9 = iVar5 + 2;
            iVar8 = 1;
          }
          if (uVar9 != uVar2) {
LAB_00200d30:
            iVar4._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<folding_set,_std::allocator<folding_set>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                (__return_storage_ptr__->
                super__Vector_base<folding_set,_std::allocator<folding_set>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<folding_set,std::allocator<folding_set>>::
              _M_realloc_insert<folding_set_const&>
                        ((vector<folding_set,std::allocator<folding_set>> *)__return_storage_ptr__,
                         iVar4,&local_48);
            }
            else {
              (iVar4._M_current)->diff = local_48.diff;
              (iVar4._M_current)->mode = local_48.mode;
              (iVar4._M_current)->range_start = local_48.range_start;
              *(undefined8 *)&(iVar4._M_current)->range_end = local_48._8_8_;
              ppfVar1 = &(__return_storage_ptr__->
                         super__Vector_base<folding_set,_std::allocator<folding_set>_>)._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppfVar1 = *ppfVar1 + 1;
            }
            uVar6 = (ulong)pfVar12->in_codepoint;
            local_48.range_start = pfVar12->in_codepoint;
            local_48.mode = 2;
            iVar8 = 2;
            lVar7 = lVar11;
            local_48.diff = lVar11;
          }
        }
      }
      pfVar12 = pfVar12 + 1;
      local_48._8_8_ = uVar6;
      lVar10 = lVar11;
    } while (pfVar12 != pfVar3);
    if (lVar7 != 0) {
      iVar4._M_current =
           (__return_storage_ptr__->super__Vector_base<folding_set,_std::allocator<folding_set>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (__return_storage_ptr__->super__Vector_base<folding_set,_std::allocator<folding_set>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<folding_set,std::allocator<folding_set>>::_M_realloc_insert<folding_set_const&>
                  ((vector<folding_set,std::allocator<folding_set>> *)__return_storage_ptr__,iVar4,
                   &local_48);
      }
      else {
        (iVar4._M_current)->diff = local_48.diff;
        (iVar4._M_current)->mode = local_48.mode;
        (iVar4._M_current)->range_start = local_48.range_start;
        *(ulong *)&(iVar4._M_current)->range_end = uVar6;
        ppfVar1 = &(__return_storage_ptr__->
                   super__Vector_base<folding_set,_std::allocator<folding_set>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppfVar1 = *ppfVar1 + 1;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<folding_set> folding_sets_from_folding_info(const std::vector<folding_info>& in_info) {
	std::vector<folding_set> result;

	folding_set current{};
	uint32_t last_match;
	for (auto& info : in_info) {
		int64_t diff = static_cast<int64_t>(info.out_codepoint) - static_cast<int64_t>(info.in_codepoint);

		if (current.diff == 0) {
			// this is a new set; set range_start and diff
			current.range_start = info.in_codepoint;
			current.diff = diff;
			last_match = info.in_codepoint;
			continue;
		}

		if (current.mode == folding_set::mode_type::single) {
			// We don't know what mode we are yet; check if this is constant
			if (diff == current.diff
				&& info.in_codepoint == last_match + 1) {
				// diff is same for range_start + 1; must be a constant-diff continuous set
				current.mode = folding_set::mode_type::constant;
				last_match = info.in_codepoint;
				continue;
			}

			// Either one-off fold, or alternating set. Check if in_codepoint is last_match + 2
			if (diff == current.diff
				&& info.in_codepoint == last_match + 2) {
				// Looks like an alternating set
				current.mode = folding_set::mode_type::alternating;
				last_match = info.in_codepoint;
				continue;
			}
		}

		if (current.mode == folding_set::mode_type::constant // For constant offset diffs to continue...
			&& current.diff == diff // Diff must be the same
			&& last_match + 1 == info.in_codepoint) { // And current codepoint must be 1 higher than previous
			// This matches the current range pattern; just update last_match and carry on
			last_match = info.in_codepoint;
			continue;
		}

		if (current.mode == folding_set::mode_type::alternating // For alternating sets to continue...
			&& current.diff == diff // Diff must be same
			&& last_match + 2 == info.in_codepoint) { // And current codepoint must be 2 higher than previous
			last_match = info.in_codepoint;
			continue;
		}

		// This isn't a continuation of the current set; push current and start a new set
		current.range_end = last_match;
		result.push_back(current);

		current = folding_set{};
		current.range_start = info.in_codepoint;
		current.diff = diff;
		last_match = info.in_codepoint;
	}

	// Push final range
	if (current.diff != 0) {
		current.range_end = last_match;
		result.push_back(current);
	}

	return result;
}